

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiply.c
# Opt level: O0

void multiply_long(arm7tdmi_t *state,arminstr_t *arminstr)

{
  uint32_t uVar1;
  uint uVar2;
  status_register_t *psVar3;
  uint uVar4;
  uint *in_RSI;
  arm7tdmi_t *in_RDI;
  uint32_t low;
  uint32_t high;
  status_register_t *psr;
  uint64_t existing;
  uint64_t result;
  uint64_t rsdata;
  uint64_t rmdata;
  multiply_long_t *instr;
  uint32_t value_3;
  uint32_t value_2;
  uint32_t value_1;
  uint32_t value;
  uint32_t in_stack_fffffffffffffe3c;
  arm7tdmi_t *in_stack_fffffffffffffe40;
  uint64_t in_stack_fffffffffffffe48;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  uint32_t local_118;
  uint32_t local_108;
  uint32_t local_f8;
  uint32_t local_e8;
  uint32_t local_ac;
  uint32_t local_9c;
  uint32_t local_8c;
  uint32_t local_7c;
  uint32_t local_6c;
  uint32_t local_5c;
  uint32_t local_4c;
  uint32_t local_40;
  
  uVar2 = *in_RSI & 0xf;
  if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
    local_e8 = in_RDI->highreg_fiq[uVar2 - 8];
  }
  else if (uVar2 < 0xd) {
    local_e8 = in_RDI->r[uVar2];
  }
  else if (uVar2 == 0xd) {
    switch((in_RDI->cpsr).raw & 0x1f) {
    case 0x11:
      local_ac = in_RDI->sp_fiq;
      break;
    case 0x12:
      local_ac = in_RDI->sp_irq;
      break;
    case 0x13:
      local_ac = in_RDI->sp_svc;
      break;
    default:
      local_ac = in_RDI->sp;
      break;
    case 0x17:
      local_ac = in_RDI->sp_abt;
      break;
    case 0x1b:
      local_ac = in_RDI->sp_und;
    }
    local_e8 = local_ac;
  }
  else if (uVar2 == 0xe) {
    switch((in_RDI->cpsr).raw & 0x1f) {
    case 0x11:
      local_6c = in_RDI->lr_fiq;
      break;
    case 0x12:
      local_6c = in_RDI->lr_irq;
      break;
    case 0x13:
      local_6c = in_RDI->lr_svc;
      break;
    default:
      local_6c = in_RDI->lr;
      break;
    case 0x17:
      local_6c = in_RDI->lr_abt;
      break;
    case 0x1b:
      local_6c = in_RDI->lr_und;
    }
    local_e8 = local_6c;
  }
  else {
    if (uVar2 != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
              ,0xa4);
      fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
      exit(1);
    }
    local_e8 = in_RDI->pc;
  }
  local_138 = (ulong)local_e8;
  uVar2 = *in_RSI >> 8 & 0xf;
  if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
    local_f8 = in_RDI->highreg_fiq[uVar2 - 8];
  }
  else if (uVar2 < 0xd) {
    local_f8 = in_RDI->r[uVar2];
  }
  else if (uVar2 == 0xd) {
    switch((in_RDI->cpsr).raw & 0x1f) {
    case 0x11:
      local_9c = in_RDI->sp_fiq;
      break;
    case 0x12:
      local_9c = in_RDI->sp_irq;
      break;
    case 0x13:
      local_9c = in_RDI->sp_svc;
      break;
    default:
      local_9c = in_RDI->sp;
      break;
    case 0x17:
      local_9c = in_RDI->sp_abt;
      break;
    case 0x1b:
      local_9c = in_RDI->sp_und;
    }
    local_f8 = local_9c;
  }
  else if (uVar2 == 0xe) {
    switch((in_RDI->cpsr).raw & 0x1f) {
    case 0x11:
      local_5c = in_RDI->lr_fiq;
      break;
    case 0x12:
      local_5c = in_RDI->lr_irq;
      break;
    case 0x13:
      local_5c = in_RDI->lr_svc;
      break;
    default:
      local_5c = in_RDI->lr;
      break;
    case 0x17:
      local_5c = in_RDI->lr_abt;
      break;
    case 0x1b:
      local_5c = in_RDI->lr_und;
    }
    local_f8 = local_5c;
  }
  else {
    if (uVar2 != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
              ,0xa4);
      fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
      exit(1);
    }
    local_f8 = in_RDI->pc;
  }
  local_140 = (ulong)local_f8;
  if ((*in_RSI >> 0x16 & 1) != 0) {
    local_138 = sign_extend_64(in_stack_fffffffffffffe48,
                               (int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                               (int)in_stack_fffffffffffffe40);
    local_140 = sign_extend_64(in_stack_fffffffffffffe48,
                               (int)((ulong)in_stack_fffffffffffffe40 >> 0x20),
                               (int)in_stack_fffffffffffffe40);
  }
  local_148 = local_138 * local_140;
  if ((*in_RSI >> 0x15 & 1) != 0) {
    uVar2 = *in_RSI >> 0x10 & 0xf;
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      local_108 = in_RDI->highreg_fiq[uVar2 - 8];
    }
    else if (uVar2 < 0xd) {
      local_108 = in_RDI->r[uVar2];
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_8c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_8c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_8c = in_RDI->sp_svc;
        break;
      default:
        local_8c = in_RDI->sp;
        break;
      case 0x17:
        local_8c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_8c = in_RDI->sp_und;
      }
      local_108 = local_8c;
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_4c = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_4c = in_RDI->lr_irq;
        break;
      case 0x13:
        local_4c = in_RDI->lr_svc;
        break;
      default:
        local_4c = in_RDI->lr;
        break;
      case 0x17:
        local_4c = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_4c = in_RDI->lr_und;
      }
      local_108 = local_4c;
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      local_108 = in_RDI->pc;
    }
    uVar2 = *in_RSI >> 0xc & 0xf;
    if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
      local_118 = in_RDI->highreg_fiq[uVar2 - 8];
    }
    else if (uVar2 < 0xd) {
      local_118 = in_RDI->r[uVar2];
    }
    else if (uVar2 == 0xd) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_7c = in_RDI->sp_fiq;
        break;
      case 0x12:
        local_7c = in_RDI->sp_irq;
        break;
      case 0x13:
        local_7c = in_RDI->sp_svc;
        break;
      default:
        local_7c = in_RDI->sp;
        break;
      case 0x17:
        local_7c = in_RDI->sp_abt;
        break;
      case 0x1b:
        local_7c = in_RDI->sp_und;
      }
      local_118 = local_7c;
    }
    else if (uVar2 == 0xe) {
      switch((in_RDI->cpsr).raw & 0x1f) {
      case 0x11:
        local_40 = in_RDI->lr_fiq;
        break;
      case 0x12:
        local_40 = in_RDI->lr_irq;
        break;
      case 0x13:
        local_40 = in_RDI->lr_svc;
        break;
      default:
        local_40 = in_RDI->lr;
        break;
      case 0x17:
        local_40 = in_RDI->lr_abt;
        break;
      case 0x1b:
        local_40 = in_RDI->lr_und;
      }
      local_118 = local_40;
    }
    else {
      if (uVar2 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
        exit(1);
      }
      local_118 = in_RDI->pc;
    }
    local_148 = CONCAT44(local_108,local_118) + local_148;
  }
  if ((*in_RSI >> 0x14 & 1) != 0) {
    psVar3 = get_psr(in_RDI);
    psVar3->raw = psVar3->raw & 0xbfffffff | (uint)(local_148 == 0) << 0x1e;
    psVar3->raw = psVar3->raw & 0x7fffffff | (uint)((long)local_148 < 0) << 0x1f;
  }
  uVar2 = (uint)(local_148 >> 0x20);
  uVar1 = (uint32_t)local_148;
  uVar4 = *in_RSI >> 0xc & 0xf;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar4,local_148 & 0xffffffff);
  }
  if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
    in_RDI->highreg_fiq[uVar4 - 8] = uVar1;
  }
  else if (uVar4 < 0xd) {
    in_RDI->r[uVar4] = uVar1;
  }
  else if (uVar4 == 0xd) {
    switch((in_RDI->cpsr).raw & 0x1f) {
    case 0x11:
      in_RDI->sp_fiq = uVar1;
      break;
    case 0x12:
      in_RDI->sp_irq = uVar1;
      break;
    case 0x13:
      in_RDI->sp_svc = uVar1;
      break;
    default:
      in_RDI->sp = uVar1;
      break;
    case 0x17:
      in_RDI->sp_abt = uVar1;
      break;
    case 0x1b:
      in_RDI->sp_und = uVar1;
    }
  }
  else if (uVar4 == 0xe) {
    switch((in_RDI->cpsr).raw & 0x1f) {
    case 0x11:
      in_RDI->lr_fiq = uVar1;
      break;
    case 0x12:
      in_RDI->lr_irq = uVar1;
      break;
    case 0x13:
      in_RDI->lr_svc = uVar1;
      break;
    default:
      in_RDI->lr = uVar1;
      break;
    case 0x17:
      in_RDI->lr_abt = uVar1;
      break;
    case 0x1b:
      in_RDI->lr_und = uVar1;
    }
  }
  else {
    if (uVar4 != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
              ,0xeb);
      fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
      exit(1);
    }
    if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
      set_pc(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    }
    else {
      set_pc(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    }
  }
  uVar4 = *in_RSI >> 0x10 & 0xf;
  if (2 < gba_log_verbosity) {
    printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar4,(ulong)uVar2);
  }
  if (((((in_RDI->cpsr).raw & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
    in_RDI->highreg_fiq[uVar4 - 8] = uVar2;
  }
  else if (uVar4 < 0xd) {
    in_RDI->r[uVar4] = uVar2;
  }
  else if (uVar4 == 0xd) {
    switch((in_RDI->cpsr).raw & 0x1f) {
    case 0x11:
      in_RDI->sp_fiq = uVar2;
      break;
    case 0x12:
      in_RDI->sp_irq = uVar2;
      break;
    case 0x13:
      in_RDI->sp_svc = uVar2;
      break;
    default:
      in_RDI->sp = uVar2;
      break;
    case 0x17:
      in_RDI->sp_abt = uVar2;
      break;
    case 0x1b:
      in_RDI->sp_und = uVar2;
    }
  }
  else if (uVar4 == 0xe) {
    switch((in_RDI->cpsr).raw & 0x1f) {
    case 0x11:
      in_RDI->lr_fiq = uVar2;
      break;
    case 0x12:
      in_RDI->lr_irq = uVar2;
      break;
    case 0x13:
      in_RDI->lr_svc = uVar2;
      break;
    default:
      in_RDI->lr = uVar2;
      break;
    case 0x17:
      in_RDI->lr_abt = uVar2;
      break;
    case 0x1b:
      in_RDI->lr_und = uVar2;
    }
  }
  else {
    if (uVar4 != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/arm_instr/../arm7tdmi.h"
              ,0xeb);
      fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
      exit(1);
    }
    if (((in_RDI->cpsr).raw >> 5 & 1) == 0) {
      set_pc(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    }
    else {
      set_pc(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
    }
  }
  return;
}

Assistant:

void multiply_long(arm7tdmi_t* state, arminstr_t* arminstr) {
    multiply_long_t* instr = &arminstr->parsed.MULTIPLY_LONG;
    uint64_t rmdata = get_register(state, instr->rm);
    uint64_t rsdata = get_register(state, instr->rs);
    if (instr->u) {
        rmdata = sign_extend_64(rmdata, 32, 64);
        rsdata = sign_extend_64(rsdata, 32, 64);
    }

    uint64_t result = rmdata * rsdata;

    if (instr->a) { // accumulate (add on to what's already set)
        uint64_t existing = get_register(state, instr->rdhi);
        existing <<= 32;
        existing |= get_register(state, instr->rdlo) & 0xFFFFFFFF;
        result += existing;
    }

    if (instr->s) {
        status_register_t* psr = get_psr(state);
        psr->Z = result == 0;
        psr->N = result >> 63;
    }

    word high = (result >> 32u) & 0xFFFFFFFF;
    word low = result & 0xFFFFFFFF;

    set_register(state, instr->rdlo, low);
    set_register(state, instr->rdhi, high);
}